

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_statemach_act(connectdata *conn)

{
  anon_union_264_9_0449b319_for_proto *pp;
  uint *puVar1;
  byte *pbVar2;
  curl_usessl cVar3;
  int *piVar4;
  imapstate iVar5;
  _Bool _Var6;
  CURLcode CVar7;
  int iVar8;
  size_t sVar9;
  uint uVar10;
  long lVar11;
  curl_socket_t sockfd;
  char *pcVar12;
  SessionHandle *pSVar13;
  size_t __n;
  pop3_conn *pop3c;
  long lVar14;
  long lVar15;
  char *chlg64;
  char *mech;
  size_t len;
  pop3state local_4c;
  pop3state state1;
  curl_socket_t local_40;
  int pop3code;
  size_t nread;
  
  sockfd = conn->sock[0];
  nread = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    return CURLE_NOT_BUILT_IN;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar7 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar7;
  }
  do {
    CVar7 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&pop3code,&nread);
    iVar8 = pop3code;
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    if (pop3code == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      pSVar13 = conn->data;
      local_40 = sockfd;
      sVar9 = strlen((pSVar13->state).buffer);
      if (iVar8 != 0x2b) {
        Curl_failf(pSVar13,"Got unexpected pop3-server response");
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      if ((3 < sVar9) && ((pSVar13->state).buffer[sVar9 - 2] == '>')) {
        __n = sVar9 - 4;
        for (lVar11 = 0x883; lVar11 - 0x880U < sVar9 - 2; lVar11 = lVar11 + 1) {
          if (*(char *)((long)pSVar13->sockets + lVar11 + -0x38) == '<') {
            if (__n != 0) {
              pcVar12 = (char *)(*Curl_ccalloc)(1,__n + 1);
              (conn->proto).imapc.mailbox_uidvalidity = pcVar12;
              if (pcVar12 != (char *)0x0) {
                memcpy(pcVar12,(void *)((long)pSVar13->sockets + lVar11 + -0x38),__n);
                (conn->proto).imapc.mailbox_uidvalidity[__n] = '\0';
                pbVar2 = (byte *)((long)&conn->proto + 0x88);
                *pbVar2 = *pbVar2 | 2;
              }
            }
            break;
          }
          __n = __n - 1;
        }
      }
      (conn->proto).pop3c.authmechs = 0;
      (conn->proto).pop3c.authused = 0;
      (conn->proto).pop3c.tls_supported = false;
      CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","CAPA");
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      (conn->proto).imapc.state = IMAP_CAPABILITY;
      sockfd = local_40;
      goto LAB_00503ddb;
    case IMAP_CAPABILITY:
      pSVar13 = conn->data;
      pcVar12 = (pSVar13->state).buffer;
      sVar9 = strlen(pcVar12);
      if (iVar8 == 0x2b) {
        cVar3 = (pSVar13->set).use_ssl;
        if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
          if ((conn->proto).pop3c.tls_supported == true) {
            CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STLS");
            if (CVar7 != CURLE_OK) {
              return CVar7;
            }
            (conn->proto).imapc.state = IMAP_STARTTLS;
            goto LAB_00503ddb;
          }
          if (cVar3 != CURLUSESSL_TRY) {
            Curl_failf(pSVar13,"STLS not supported.");
            return CURLE_USE_SSL_FAILED;
          }
        }
      }
      else {
        if (iVar8 == 0x2a) {
          if (3 < sVar9) {
            if (*(int *)pcVar12 == 0x534c5453) {
              (conn->proto).pop3c.tls_supported = true;
            }
            else if (*(int *)pcVar12 == 0x52455355) {
              pbVar2 = (byte *)((long)&conn->proto + 0x88);
              *pbVar2 = *pbVar2 | 1;
            }
            else if ((sVar9 != 4) && (iVar8 = bcmp(pcVar12,"SASL ",5), iVar8 == 0)) {
              pbVar2 = (byte *)((long)&conn->proto + 0x88);
              *pbVar2 = *pbVar2 | 4;
              pcVar12 = (pSVar13->state).buffer + 5;
              lVar11 = sVar9 - 5;
              while (lVar11 != 0) {
                if (((ulong)(byte)*pcVar12 < 0x21) &&
                   ((0x100002600U >> ((ulong)(byte)*pcVar12 & 0x3f) & 1) != 0)) {
                  pcVar12 = pcVar12 + 1;
                  lVar11 = lVar11 + -1;
                }
                else {
                  lVar14 = 0;
                  while ((lVar15 = lVar11, lVar11 != lVar14 &&
                         ((0x20 < (ulong)(byte)pcVar12[lVar14] ||
                          (lVar15 = lVar14,
                          (0x100002600U >> ((ulong)(byte)pcVar12[lVar14] & 0x3f) & 1) == 0))))) {
                    lVar14 = lVar14 + 1;
                  }
                  switch(lVar15) {
                  case 4:
                    uVar10 = 0x40;
                    if (*(int *)pcVar12 != 0x4d4c544e) break;
                    goto LAB_005039f6;
                  case 5:
                    iVar8 = bcmp(pcVar12,"LOGIN",5);
                    uVar10 = 1;
                    if (iVar8 == 0) goto LAB_005039f6;
                    iVar8 = bcmp(pcVar12,"PLAIN",5);
                    uVar10 = 2;
                    goto LAB_005039a6;
                  case 6:
                    iVar8 = bcmp(pcVar12,"GSSAPI",6);
                    uVar10 = 0x10;
                    goto LAB_005039a6;
                  case 7:
                    iVar8 = bcmp(pcVar12,"XOAUTH2",7);
                    if (iVar8 == 0) {
                      uVar10 = 0x80;
                      goto LAB_005039f6;
                    }
                    break;
                  case 8:
                    uVar10 = 4;
                    if ((*(long *)pcVar12 == 0x35444d2d4d415243) ||
                       (uVar10 = 0x20, *(long *)pcVar12 == 0x4c414e5245545845)) goto LAB_005039f6;
                    break;
                  case 10:
                    iVar8 = bcmp(pcVar12,"DIGEST-MD5",10);
                    uVar10 = 8;
LAB_005039a6:
                    if (iVar8 == 0) {
LAB_005039f6:
                      puVar1 = &(conn->proto).pop3c.authmechs;
                      *puVar1 = *puVar1 | uVar10;
                    }
                  }
                  pcVar12 = pcVar12 + lVar15;
                  lVar11 = lVar11 - lVar15;
                }
              }
            }
          }
          goto LAB_00503ddb;
        }
        pbVar2 = (byte *)((long)&conn->proto + 0x88);
        *pbVar2 = *pbVar2 | 1;
      }
      goto LAB_00503cf6;
    case IMAP_STARTTLS:
      if (pop3code == 0x2b) {
        return CURLE_NOT_BUILT_IN;
      }
      if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
        Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)(uint)pop3code);
        return CURLE_USE_SSL_FAILED;
      }
LAB_00503cf6:
      CVar7 = pop3_perform_authentication(conn);
      break;
    default:
switchD_005035bf_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    case IMAP_AUTHENTICATE_PLAIN:
      pSVar13 = conn->data;
      mech = (char *)0x0;
      chlg64 = (char *)0x0;
      if (pop3code == 0x2b) {
        CVar7 = Curl_sasl_create_plain_message
                          (pSVar13,conn->user,conn->passwd,&chlg64,(size_t *)&mech);
        goto LAB_00503b25;
      }
      pcVar12 = "Access denied. %c";
LAB_00503c79:
      mech = (char *)0x0;
      chlg64 = (char *)0x0;
      Curl_failf(pSVar13,pcVar12,(ulong)(uint)pop3code);
      CVar7 = CURLE_LOGIN_DENIED;
      goto LAB_00503c8e;
    case IMAP_AUTHENTICATE_LOGIN:
      pSVar13 = conn->data;
      mech = (char *)0x0;
      chlg64 = (char *)0x0;
      if (pop3code != 0x2b) {
LAB_00503b71:
        pcVar12 = "Access denied: %d";
        goto LAB_00503c79;
      }
      CVar7 = Curl_sasl_create_login_message(pSVar13,conn->user,&chlg64,(size_t *)&mech);
      if ((chlg64 == (char *)0x0 || CVar7 != CURLE_OK) ||
         (CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar7 != CURLE_OK)) goto LAB_00503c8e;
      (conn->proto).imapc.state = IMAP_AUTHENTICATE_LOGIN_PASSWD;
      goto LAB_00503b69;
    case IMAP_AUTHENTICATE_LOGIN_PASSWD:
      pSVar13 = conn->data;
      mech = (char *)0x0;
      chlg64 = (char *)0x0;
      if (pop3code != 0x2b) goto LAB_00503b71;
      CVar7 = Curl_sasl_create_login_message(pSVar13,conn->passwd,&chlg64,(size_t *)&mech);
      goto LAB_00503b25;
    case IMAP_AUTHENTICATE_CRAMMD5:
      pSVar13 = conn->data;
      mech = (char *)0x0;
      chlg64 = (char *)0x0;
      len = 0;
      _state1 = 0;
      if (pop3code == 0x2b) {
        pop3_get_message((pSVar13->state).buffer,&chlg64);
        CVar7 = Curl_sasl_decode_cram_md5_message(chlg64,&mech,(size_t *)&state1);
        if (CVar7 == CURLE_OK) {
          CVar7 = Curl_sasl_create_cram_md5_message
                            (pSVar13,mech,conn->user,conn->passwd,(char **)&len,(size_t *)&state1);
          if (len != 0 && CVar7 == CURLE_OK) {
            CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s");
            iVar5 = IMAP_AUTHENTICATE_FINAL;
            goto LAB_00503d59;
          }
        }
        else {
          CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*");
          iVar5 = IMAP_AUTHENTICATE_CANCEL;
LAB_00503d59:
          if (CVar7 == CURLE_OK) {
            (conn->proto).imapc.state = iVar5;
            CVar7 = CURLE_OK;
          }
        }
        pcVar12 = (char *)len;
        if (mech != (char *)0x0) {
          (*Curl_cfree)(mech);
          mech = (char *)0x0;
          pcVar12 = (char *)len;
        }
        goto LAB_00503db7;
      }
LAB_00503c56:
      len = 0;
      mech = (char *)0x0;
      chlg64 = (char *)0x0;
      Curl_failf(pSVar13,"Access denied: %d",(ulong)(uint)pop3code);
LAB_00503c6a:
      CVar7 = CURLE_LOGIN_DENIED;
      break;
    case IMAP_AUTHENTICATE_DIGESTMD5:
      pSVar13 = conn->data;
      mech = (char *)0x0;
      chlg64 = (char *)0x0;
      len = 0;
      if (pop3code != 0x2b) goto LAB_00503c56;
      pop3_get_message((pSVar13->state).buffer,&mech);
      CVar7 = Curl_sasl_create_digest_md5_message
                        (pSVar13,mech,conn->user,conn->passwd,"pop",&chlg64,&len);
      if (CVar7 == CURLE_OK) {
        CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",chlg64);
        iVar5 = IMAP_AUTHENTICATE_DIGESTMD5_RESP;
      }
      else {
        pcVar12 = chlg64;
        if (CVar7 != CURLE_BAD_CONTENT_ENCODING) goto LAB_00503db7;
        CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*");
        iVar5 = IMAP_AUTHENTICATE_CANCEL;
      }
      pcVar12 = chlg64;
      if (CVar7 == CURLE_OK) {
        (conn->proto).imapc.state = iVar5;
        CVar7 = CURLE_OK;
      }
LAB_00503db7:
      if (pcVar12 == (char *)0x0) break;
      goto LAB_00503dbc;
    case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
      if (pop3code != 0x2b) goto LAB_00503f27;
      CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","");
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      (conn->proto).imapc.state = IMAP_AUTHENTICATE_FINAL;
      goto LAB_00503ddb;
    case IMAP_AUTHENTICATE_XOAUTH2:
      pSVar13 = conn->data;
      mech = (char *)0x0;
      chlg64 = (char *)0x0;
      if (pop3code != 0x2b) goto LAB_00503b71;
      CVar7 = Curl_sasl_create_xoauth2_message
                        (pSVar13,conn->user,conn->xoauth2_bearer,&chlg64,(size_t *)&mech);
LAB_00503b25:
      if ((chlg64 != (char *)0x0 && CVar7 == CURLE_OK) &&
         (CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar7 == CURLE_OK)) {
        (conn->proto).imapc.state = IMAP_AUTHENTICATE_FINAL;
LAB_00503b69:
        CVar7 = CURLE_OK;
      }
LAB_00503c8e:
      pcVar12 = chlg64;
      if (chlg64 != (char *)0x0) {
LAB_00503dbc:
        (*Curl_cfree)(pcVar12);
      }
      break;
    case IMAP_AUTHENTICATE_CANCEL:
      pSVar13 = conn->data;
      mech = (char *)0x0;
      chlg64 = (char *)0x0;
      len = 0;
      _state1 = _state1 & 0xffffffff00000000;
      local_4c = POP3_STOP;
      puVar1 = &(conn->proto).pop3c.authmechs;
      *puVar1 = *puVar1 ^ (conn->proto).pop3c.authused;
      CVar7 = pop3_calc_sasl_details(conn,&mech,&chlg64,&len,&state1,&local_4c);
      if (CVar7 == CURLE_OK) {
        if (mech != (char *)0x0) {
          CVar7 = pop3_perform_auth(conn,mech,chlg64,len,state1,local_4c);
          pcVar12 = chlg64;
          goto LAB_00503db7;
        }
        uVar10 = (conn->proto).pop3c.authtypes;
        if (((uVar10 & 2) == 0) || (((conn->proto).imapc.resptag[4] & 2U) == 0)) {
          if (((uVar10 & 1) == 0) || (((conn->proto).imapc.resptag[4] & 1U) == 0)) {
            Curl_failf(pSVar13,"Authentication cancelled");
            goto LAB_00503c6a;
          }
          CVar7 = pop3_perform_user(conn);
        }
        else {
          CVar7 = pop3_perform_apop(conn);
        }
      }
      break;
    case IMAP_AUTHENTICATE_FINAL:
    case IMAP_LOGIN:
      if (pop3code == 0x2b) goto switchD_005035bf_caseD_4;
LAB_00503f27:
      pSVar13 = conn->data;
      pcVar12 = "Authentication failed: %d";
LAB_00503f52:
      Curl_failf(pSVar13,pcVar12,(ulong)(uint)pop3code);
      return CURLE_LOGIN_DENIED;
    case IMAP_LIST:
      if (pop3code != 0x2b) goto LAB_00503f48;
      pcVar12 = conn->passwd;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "";
      }
      CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar12);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      (conn->proto).imapc.state = IMAP_SELECT;
      goto LAB_00503ddb;
    case IMAP_SELECT:
      if (pop3code == 0x2b) goto switchD_005035bf_caseD_4;
LAB_00503f48:
      pSVar13 = conn->data;
      pcVar12 = "Access denied. %c";
      goto LAB_00503f52;
    case IMAP_FETCH:
      CVar7 = CURLE_RECV_ERROR;
      if (pop3code == 0x2b) {
        pSVar13 = conn->data;
        piVar4 = (int *)(pSVar13->req).protop;
        (conn->proto).pop3c.eob = 2;
        (conn->proto).pop3c.strip = 2;
        CVar7 = CURLE_OK;
        if (*piVar4 == 0) {
          Curl_setup_transfer(conn,0,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
          pcVar12 = (conn->proto).ftpc.pp.cache;
          CVar7 = CURLE_OK;
          if (pcVar12 != (char *)0x0) {
            if ((pSVar13->set).opt_no_body == false) {
              CVar7 = Curl_pop3_write(conn,pcVar12,(conn->proto).rtspc.rtp_bufsize);
              if (CVar7 != CURLE_OK) {
                return CVar7;
              }
              pcVar12 = (pp->ftpc).pp.cache;
              if (pcVar12 != (char *)0x0) goto LAB_0050373b;
            }
            else {
LAB_0050373b:
              (*Curl_cfree)(pcVar12);
              (pp->ftpc).pp.cache = (char *)0x0;
            }
            (conn->proto).ftpc.pp.cache_size = 0;
            CVar7 = CURLE_OK;
          }
        }
      }
      (conn->proto).imapc.state = IMAP_STOP;
    }
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_00503ddb:
    _Var6 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var6) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode pop3_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

 do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &pop3code, &nread);
    if(result)
      return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_PLAIN:
      result = pop3_state_auth_plain_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_LOGIN:
      result = pop3_state_auth_login_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_LOGIN_PASSWD:
      result = pop3_state_auth_login_password_resp(conn, pop3code,
                                                   pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_AUTH_CRAMMD5:
      result = pop3_state_auth_cram_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_DIGESTMD5:
      result = pop3_state_auth_digest_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_DIGESTMD5_RESP:
      result = pop3_state_auth_digest_resp_resp(conn, pop3code, pop3c->state);
      break;
#endif

#ifdef USE_NTLM
    case POP3_AUTH_NTLM:
      result = pop3_state_auth_ntlm_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_NTLM_TYPE2MSG:
      result = pop3_state_auth_ntlm_type2msg_resp(conn, pop3code,
                                                  pop3c->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case POP3_AUTH_GSSAPI:
      result = pop3_state_auth_gssapi_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_GSSAPI_TOKEN:
      result = pop3_state_auth_gssapi_token_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_GSSAPI_NO_DATA:
      result = pop3_state_auth_gssapi_no_data_resp(conn, pop3code,
                                                   pop3c->state);
      break;
#endif

    case POP3_AUTH_XOAUTH2:
      result = pop3_state_auth_xoauth2_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_CANCEL:
      result = pop3_state_auth_cancel_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_FINAL:
      result = pop3_state_auth_final_resp(conn, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(conn, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}